

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O0

void __thiscall findstr::searchsequential(findstr *this,filehandle *f,string *origin)

{
  char *pcVar1;
  reference pvVar2;
  int iVar3;
  reference __dest;
  size_type sVar4;
  ssize_t sVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  long lVar7;
  anon_class_32_4_06483525 local_d8;
  function<bool_(const_char_*,_const_char_*)> local_b8;
  reference local_98;
  char *partial;
  char *readend;
  int n;
  int needed;
  char *readptr;
  shared_ptr<SearchBase> searcher;
  uint64_t offset;
  char *bufend;
  char *bufstart;
  allocator_type local_39;
  undefined1 local_38 [8];
  vector<char,_std::allocator<char>_> buf;
  string *origin_local;
  filehandle *f_local;
  findstr *this_local;
  
  this->nameprinted = false;
  this->matchcount = 0;
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = origin;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_38,0x100000,&local_39);
  std::allocator<char>::~allocator(&local_39);
  __dest = std::vector<char,_std::allocator<char>_>::front
                     ((vector<char,_std::allocator<char>_> *)local_38);
  sVar4 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_38);
  offset._0_4_ = (int)__dest + (int)sVar4;
  searcher.super___shared_ptr<SearchBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  makesearcher((findstr *)&readptr);
  _n = __dest;
  while( true ) {
    while( true ) {
      readend._4_4_ = (int)offset - n;
      iVar3 = filehandle::operator_cast_to_int(f);
      sVar5 = read(iVar3,_n,(long)readend._4_4_);
      readend._0_4_ = (int)sVar5;
      if ((int)readend != 0) break;
      if ((this->readcontinuous & 1U) == 0) goto LAB_0011fb43;
      usleep(100);
    }
    if ((readend._4_4_ < (int)readend) || ((int)readend < 0)) break;
    partial = _n + (int)readend;
    peVar6 = std::__shared_ptr_access<SearchBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SearchBase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&readptr);
    pcVar1 = partial;
    local_d8.origin = (string *)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
    local_d8.offset =
         (uint64_t)
         searcher.super___shared_ptr<SearchBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_d8.bufstart = __dest;
    local_d8.this = this;
    std::function<bool(char_const*,char_const*)>::
    function<findstr::searchsequential(filehandle&,std::__cxx11::string_const&)::_lambda(char_const*,char_const*)_1_,void>
              ((function<bool(char_const*,char_const*)> *)&local_b8,&local_d8);
    iVar3 = (*peVar6->_vptr_SearchBase[2])(peVar6,__dest,pcVar1,&local_b8);
    local_98 = (reference)CONCAT44(extraout_var,iVar3);
    std::function<bool_(const_char_*,_const_char_*)>::~function(&local_b8);
    if ((local_98 == (reference)0x0) || ((this->matchstart & 1U) != 0)) break;
    lVar7 = (long)local_98 - (long)__dest;
    sVar4 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_38);
    if (lVar7 < (int)((long)((ulong)(uint)((int)sVar4 >> 0x1f) << 0x20 | sVar4 & 0xffffffff) / 2)) {
      sVar4 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)local_38);
      local_98 = __dest + (sVar4 >> 1);
    }
    pvVar2 = __dest;
    if (local_98 < partial) {
      memcpy(__dest,local_98,(long)partial - (long)local_98);
      readend._0_4_ = (int)readend - ((int)partial - (int)local_98);
      pvVar2 = __dest + ((long)partial - (long)local_98);
    }
    _n = pvVar2;
    searcher.super___shared_ptr<SearchBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(searcher.super___shared_ptr<SearchBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base + (long)(int)readend);
  }
LAB_0011fb43:
  if ((this->count_only & 1U) != 0) {
    print<int&,char_const(&)[2]>("%6d %s\n",&this->matchcount,(char (*) [2])"-");
  }
  if ((this->nameprinted & 1U) != 0) {
    print<>("\n");
  }
  std::shared_ptr<SearchBase>::~shared_ptr((shared_ptr<SearchBase> *)&readptr);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_38)
  ;
  return;
}

Assistant:

void searchsequential(filehandle& f, const std::string& origin)
    {
        //printf("searching stdin\n");
        // see: http://www.boost.org/doc/libs/1_52_0/libs/regex/doc/html/boost_regex/partial_matches.html

        nameprinted = false;
        matchcount = 0;

        std::vector<char> buf(0x100000);
        char *bufstart = &buf.front();
        char *bufend = bufstart + buf.size();
        uint64_t offset = 0;

        auto searcher = makesearcher();

        char *readptr = bufstart;

        while (true)
        {
            int needed = bufend - readptr;
            //print("%08x ; %x: needed = %d -> %p .. %p .. %p\n", offset, lseek(f, 0, 1), needed, bufstart, readptr, bufend);
            int n = read(f, readptr, needed);
            if (n == 0) {
                if (readcontinuous) {
                    //printf("stdin: waiting for more\n");
#ifdef _WIN32
                    Sleep(10);
#else
                    usleep(100);
#endif
                    continue;
                }
                //print("read empty(need=%d), pos=%d\n", needed, lseek(f, 0, 1));
                break;
            }
            else if (n > needed || n < 0)
            {
                //perror("read");
                //print("n=%d\n", n);
                break;
            }

            char *readend = readptr + n;
            const char *partial;

            partial = searcher->search(bufstart, readend, [&origin, bufstart, offset, this](const char *first, const char *last)->bool {
                return writeresult(origin, bufstart, offset, first, last);
            });
            if (partial==NULL)  // writeresult told searcher to stop
                break;
            if (matchstart)
                break;

            // avoid too large partial matches
            if (partial - bufstart < (int)buf.size()/2)
                partial = bufstart + buf.size()/2;

            // relocate data for partial matches
            if (partial < readend) {
                memcpy(bufstart, partial, readend - partial);
                readptr = bufstart + (readend - partial);
                n -= (readend - partial);
            }
            else {
                readptr = bufstart;
            }

            offset += n;
        }
        if (count_only)
            print("%6d %s\n", matchcount, "-");
        if (nameprinted)
            print("\n");
    }